

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

void ftxui::anon_unknown_0::UpdatePixelStyle
               (Screen *screen,stringstream *ss,Pixel *prev,Pixel *next)

{
  ostream *poVar1;
  string *psVar2;
  char *pcVar3;
  bool bVar4;
  bool local_129;
  char *local_128;
  char *local_120;
  byte local_10a;
  byte local_109;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Pixel *local_28;
  Pixel *next_local;
  Pixel *prev_local;
  stringstream *ss_local;
  Screen *screen_local;
  
  local_28 = next;
  next_local = prev;
  prev_local = (Pixel *)ss;
  ss_local = (stringstream *)screen;
  if (next->hyperlink != prev->hyperlink) {
    poVar1 = std::operator<<((ostream *)(ss + 0x10),"\x1b]8;;");
    psVar2 = Screen::Hyperlink_abi_cxx11_((Screen *)ss_local,local_28->hyperlink);
    poVar1 = std::operator<<(poVar1,(string *)psVar2);
    std::operator<<(poVar1,"\x1b\\");
  }
  if ((*(byte *)local_28 >> 1 & 1) != (*(byte *)next_local >> 1 & 1) ||
      (*(byte *)local_28 >> 2 & 1) != (*(byte *)next_local >> 2 & 1)) {
    if (((*(byte *)next_local >> 1 & 1) == 0) || (local_109 = 1, (*(byte *)local_28 >> 1 & 1) != 0))
    {
      local_10a = 0;
      if ((*(byte *)next_local >> 2 & 1) != 0) {
        local_10a = *(byte *)local_28 >> 2 & 1 ^ 0xff;
      }
      local_109 = local_10a;
    }
    pcVar3 = "";
    if ((local_109 & 1) != 0) {
      pcVar3 = "\x1b[22m";
    }
    std::operator<<((ostream *)&(prev_local->character)._M_string_length,pcVar3);
    pcVar3 = "";
    if ((*(byte *)local_28 >> 1 & 1) != 0) {
      pcVar3 = "\x1b[1m";
    }
    std::operator<<((ostream *)&(prev_local->character)._M_string_length,pcVar3);
    pcVar3 = "";
    if ((*(byte *)local_28 >> 2 & 1) != 0) {
      pcVar3 = "\x1b[2m";
    }
    std::operator<<((ostream *)&(prev_local->character)._M_string_length,pcVar3);
  }
  bVar4 = true;
  if ((*(byte *)local_28 >> 4 & 1) == (*(byte *)next_local >> 4 & 1)) {
    bVar4 = (*(byte *)local_28 >> 5 & 1) != (*(byte *)next_local >> 5 & 1);
  }
  if (bVar4) {
    if ((*(byte *)local_28 >> 4 & 1) == 0) {
      if ((*(byte *)local_28 >> 5 & 1) == 0) {
        local_128 = "\x1b[24m";
      }
      else {
        local_128 = "\x1b[21m";
      }
      local_120 = local_128;
    }
    else {
      local_120 = "\x1b[4m";
    }
    std::operator<<((ostream *)&(prev_local->character)._M_string_length,local_120);
  }
  if ((*(byte *)local_28 & 1) != (*(byte *)next_local & 1)) {
    pcVar3 = "\x1b[25m";
    if ((undefined1  [48])((undefined1  [48])*local_28 & (undefined1  [48])0x1) !=
        (undefined1  [48])0x0) {
      pcVar3 = "\x1b[5m";
    }
    std::operator<<((ostream *)&(prev_local->character)._M_string_length,pcVar3);
  }
  if ((*(byte *)local_28 >> 3 & 1) != (*(byte *)next_local >> 3 & 1)) {
    pcVar3 = "\x1b[27m";
    if ((*(byte *)local_28 >> 3 & 1) != 0) {
      pcVar3 = "\x1b[7m";
    }
    std::operator<<((ostream *)&(prev_local->character)._M_string_length,pcVar3);
  }
  if ((*(byte *)local_28 >> 6 & 1) != (*(byte *)next_local >> 6 & 1)) {
    pcVar3 = "\x1b[29m";
    if ((*(byte *)local_28 >> 6 & 1) != 0) {
      pcVar3 = "\x1b[9m";
    }
    std::operator<<((ostream *)&(prev_local->character)._M_string_length,pcVar3);
  }
  bVar4 = Color::operator!=(&local_28->foreground_color,&next_local->foreground_color);
  local_129 = true;
  if (!bVar4) {
    local_129 = Color::operator!=(&local_28->background_color,&next_local->background_color);
  }
  if (local_129 != false) {
    psVar2 = &prev_local->character;
    Color::Print_abi_cxx11_(&local_88,&local_28->foreground_color,false);
    std::operator+(&local_68,"\x1b[",&local_88);
    std::operator+(&local_48,&local_68,"m");
    std::operator<<((ostream *)&psVar2->_M_string_length,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    psVar2 = &prev_local->character;
    Color::Print_abi_cxx11_(&local_f8,&local_28->background_color,true);
    std::operator+(&local_d8,"\x1b[",&local_f8);
    std::operator+(&local_b8,&local_d8,"m");
    std::operator<<((ostream *)&psVar2->_M_string_length,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  return;
}

Assistant:

void UpdatePixelStyle(const Screen* screen,
                      std::stringstream& ss,
                      const Pixel& prev,
                      const Pixel& next) {
  // See https://gist.github.com/egmontkob/eb114294efbcd5adb1944c9f3cb5feda
  if (FTXUI_UNLIKELY(next.hyperlink != prev.hyperlink)) {
    ss << "\x1B]8;;" << screen->Hyperlink(next.hyperlink) << "\x1B\\";
  }

  // Bold
  if (FTXUI_UNLIKELY((next.bold ^ prev.bold) | (next.dim ^ prev.dim))) {
    // BOLD_AND_DIM_RESET:
    ss << ((prev.bold && !next.bold) || (prev.dim && !next.dim) ? "\x1B[22m"
                                                                : "");
    ss << (next.bold ? "\x1B[1m" : "");  // BOLD_SET
    ss << (next.dim ? "\x1B[2m" : "");   // DIM_SET
  }

  // Underline
  if (FTXUI_UNLIKELY(next.underlined != prev.underlined ||
                     next.underlined_double != prev.underlined_double)) {
    ss << (next.underlined          ? "\x1B[4m"     // UNDERLINE
           : next.underlined_double ? "\x1B[21m"    // UNDERLINE_DOUBLE
                                    : "\x1B[24m");  // UNDERLINE_RESET
  }

  // Blink
  if (FTXUI_UNLIKELY(next.blink != prev.blink)) {
    ss << (next.blink ? "\x1B[5m"     // BLINK_SET
                      : "\x1B[25m");  // BLINK_RESET
  }

  // Inverted
  if (FTXUI_UNLIKELY(next.inverted != prev.inverted)) {
    ss << (next.inverted ? "\x1B[7m"     // INVERTED_SET
                         : "\x1B[27m");  // INVERTED_RESET
  }

  // StrikeThrough
  if (FTXUI_UNLIKELY(next.strikethrough != prev.strikethrough)) {
    ss << (next.strikethrough ? "\x1B[9m"     // CROSSED_OUT
                              : "\x1B[29m");  // CROSSED_OUT_RESET
  }

  if (FTXUI_UNLIKELY(next.foreground_color != prev.foreground_color ||
                     next.background_color != prev.background_color)) {
    ss << "\x1B[" + next.foreground_color.Print(false) + "m";
    ss << "\x1B[" + next.background_color.Print(true) + "m";
  }
}